

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.hpp
# Opt level: O0

void __thiscall
webfront::log::
debug<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::debug
          (debug<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,string_view fmt,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts,srcLoc *l)

{
  bool bVar1;
  undefined1 in_stack_00000038 [16];
  
  bVar1 = anon_unknown_4::is('\x04');
  if (bVar1) {
    (anonymous_namespace)::log<std::__cxx11::string>
              (fmt._M_str._7_1_,(string_view)in_stack_00000038,(srcLoc *)fmt._M_len,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  }
  return;
}

Assistant:

debug(string_view fmt, Ts&&... ts, const srcLoc& l = srcLoc::current()) {
    if (is(Debug)) log(Debug, fmt, l, std::forward<Ts>(ts)...);
    }